

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_init_find_case(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  bson_init(local_180);
  cVar1 = bson_append_int32(local_180,"FOO",0xffffffffffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_int32 (&b, \"FOO\", -1, 1234)";
    uVar3 = 0x20b;
  }
  else {
    cVar1 = bson_iter_init_find_case(auStack_200,local_180,"foo");
    if (cVar1 != '\0') {
      iVar2 = bson_iter_int32(auStack_200);
      if (iVar2 == 0x4d2) {
        bson_destroy(local_180);
        return;
      }
      fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)bson_iter_int32 (&iter) == 1234\n",0x20d);
      abort();
    }
    pcVar4 = "bson_iter_init_find_case (&iter, &b, \"foo\")";
    uVar3 = 0x20c;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_init_find_case",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_init_find_case (void)
{
   bson_t b;
   bson_iter_t iter;

   bson_init (&b);
   BSON_ASSERT (bson_append_int32 (&b, "FOO", -1, 1234));
   BSON_ASSERT (bson_iter_init_find_case (&iter, &b, "foo"));
   BSON_ASSERT_CMPINT (bson_iter_int32 (&iter), ==, 1234);
   bson_destroy (&b);
}